

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zet_valddi.cpp
# Opt level: O2

ze_result_t
validation_layer::zetKernelGetProfileInfo
          (zet_kernel_handle_t hKernel,zet_profile_properties_t *pProfileProperties)

{
  Logger *this;
  long *plVar1;
  long lVar2;
  ze_result_t result;
  ze_result_t zVar3;
  size_t i;
  long lVar4;
  long lVar5;
  allocator local_59;
  code *local_58;
  string local_50;
  
  lVar2 = context;
  this = *(Logger **)(context + 0xd50);
  std::__cxx11::string::string
            ((string *)&local_50,"zetKernelGetProfileInfo(hKernel, pProfileProperties)",&local_59);
  loader::Logger::log_trace(this,&local_50);
  std::__cxx11::string::~string((string *)&local_50);
  if (*(code **)(lVar2 + 0x728) == (code *)0x0) {
    result = ZE_RESULT_ERROR_UNSUPPORTED_FEATURE;
  }
  else {
    lVar5 = *(long *)(lVar2 + 0xd38) - *(long *)(lVar2 + 0xd30) >> 3;
    lVar4 = 0;
    local_58 = *(code **)(lVar2 + 0x728);
    do {
      if (lVar5 == lVar4) {
        if ((*(char *)(lVar2 + 4) != '\x01') ||
           (result = ZETHandleLifetimeValidation::zetKernelGetProfileInfoPrologue
                               ((ZETHandleLifetimeValidation *)(*(long *)(lVar2 + 0xd48) + 0x10),
                                hKernel,pProfileProperties), result == ZE_RESULT_SUCCESS)) {
          zVar3 = (*local_58)(hKernel,pProfileProperties);
          lVar4 = 0;
          goto LAB_00162f10;
        }
        break;
      }
      plVar1 = *(long **)(*(long *)(*(long *)(lVar2 + 0xd30) + lVar4 * 8) + 0x10);
      result = (**(code **)(*plVar1 + 0x210))(plVar1,hKernel,pProfileProperties);
      lVar4 = lVar4 + 1;
    } while (result == ZE_RESULT_SUCCESS);
  }
  goto LAB_00162f3e;
  while( true ) {
    plVar1 = *(long **)(*(long *)(*(long *)(lVar2 + 0xd30) + lVar4 * 8) + 0x10);
    result = (**(code **)(*plVar1 + 0x218))(plVar1,hKernel,pProfileProperties,zVar3);
    lVar4 = lVar4 + 1;
    if (result != ZE_RESULT_SUCCESS) break;
LAB_00162f10:
    result = zVar3;
    if (lVar5 == lVar4) break;
  }
LAB_00162f3e:
  logAndPropagateResult("zetKernelGetProfileInfo",result);
  return result;
}

Assistant:

__zedlllocal ze_result_t ZE_APICALL
    zetKernelGetProfileInfo(
        zet_kernel_handle_t hKernel,                    ///< [in] handle to kernel
        zet_profile_properties_t* pProfileProperties    ///< [out] pointer to profile properties
        )
    {
        context.logger->log_trace("zetKernelGetProfileInfo(hKernel, pProfileProperties)");

        auto pfnGetProfileInfo = context.zetDdiTable.Kernel.pfnGetProfileInfo;

        if( nullptr == pfnGetProfileInfo )
            return logAndPropagateResult("zetKernelGetProfileInfo", ZE_RESULT_ERROR_UNSUPPORTED_FEATURE);

        auto numValHandlers = context.validationHandlers.size();
        for (size_t i = 0; i < numValHandlers; i++) {
            auto result = context.validationHandlers[i]->zetValidation->zetKernelGetProfileInfoPrologue( hKernel, pProfileProperties );
            if(result!=ZE_RESULT_SUCCESS) return logAndPropagateResult("zetKernelGetProfileInfo", result);
        }


        if( context.enableThreadingValidation ){ 
            //Unimplemented
        }

        
        if(context.enableHandleLifetime ){
            auto result = context.handleLifetime->zetHandleLifetime.zetKernelGetProfileInfoPrologue( hKernel, pProfileProperties );
            if(result!=ZE_RESULT_SUCCESS) return logAndPropagateResult("zetKernelGetProfileInfo", result);
        }

        auto driver_result = pfnGetProfileInfo( hKernel, pProfileProperties );

        for (size_t i = 0; i < numValHandlers; i++) {
            auto result = context.validationHandlers[i]->zetValidation->zetKernelGetProfileInfoEpilogue( hKernel, pProfileProperties ,driver_result);
            if(result!=ZE_RESULT_SUCCESS) return logAndPropagateResult("zetKernelGetProfileInfo", result);
        }

        return logAndPropagateResult("zetKernelGetProfileInfo", driver_result);
    }